

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fiord(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tctx,char *fname,char *exename,
          fiolcxdef *setupctx,objnum *preinit,uint *flagp,tokpdef *path,uchar **fmtsp,uint *fmtlp,
          uint *pcntptr,int flags,appctxdef *appctx,char *argv0)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  dbgcxdef *pdVar4;
  char cVar5;
  char cVar6;
  objnum oVar7;
  uint uVar8;
  int resfileno;
  size_t sVar9;
  FILE *pFVar10;
  ulong uVar11;
  size_t sVar12;
  uchar *puVar13;
  tokthdef *toktab1;
  mclhd loadhd;
  ushort *__ptr;
  size_t sVar14;
  byte *__ptr_00;
  long lVar15;
  runxdef *prVar16;
  char *filename;
  char *pcVar17;
  int iVar18;
  ushort *puVar19;
  ulong __off;
  ulong uVar20;
  ulong __off_00;
  uint siz;
  uint uVar21;
  uint uVar22;
  errcxdef *ctx;
  byte *pbVar23;
  byte *pbVar24;
  ulong uVar25;
  char *pcVar26;
  ushort *puVar27;
  uint inc;
  ulong uVar28;
  undefined1 auVar29 [16];
  char suffix_uc [4];
  char suffix_lc [4];
  undefined1 local_11c8 [4];
  int iStack_11c4;
  undefined5 uStack_11c0;
  undefined4 local_11bb;
  undefined3 uStack_11b7;
  char resname [4096];
  errdef fr_;
  
  *preinit = 0xffff;
  pcVar17 = fname;
  if (fname == (char *)0x0) {
    pcVar17 = exename;
  }
  if (pcVar17 == (char *)0x0) {
    G_os_gamename[0] = '\0';
  }
  else {
    sVar9 = strlen(pcVar17);
    sVar12 = 0xfff;
    if (sVar9 < 0xfff) {
      sVar12 = sVar9;
    }
    memcpy(G_os_gamename,pcVar17,sVar12);
    G_os_gamename[sVar12] = '\0';
  }
  if (fname == (char *)0x0) {
    pFVar10 = (FILE *)os_exeseek(exename,"TGAM");
  }
  else {
    pFVar10 = fopen(fname,"rb");
  }
  if (pFVar10 == (FILE *)0x0) {
    errsigf(vctx->voccxerr,"TADS",0x25e);
  }
  if ((appctx != (appctxdef *)0x0) && (appctx->set_game_name != (_func_void_void_ptr_char_ptr *)0x0)
     ) {
    (*appctx->set_game_name)(appctx->set_game_name_ctx,pcVar17);
  }
  uVar11 = ftell(pFVar10);
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode != 0) {
    vctx->voccxerr->errcxptr = fr_.errprv;
    fclose(pFVar10);
    errrse1(vctx->voccxerr,&fr_);
  }
  fr_.errprv = vctx->voccxerr->errcxptr;
  vctx->voccxerr->errcxptr = &fr_;
  ctx = vctx->voccxerr;
  setupctx->fiolcxfp = (osfildef *)pFVar10;
  setupctx->fiolcxerr = ctx;
  setupctx->fiolcxst = uVar11;
  setupctx->fiolcxseed = 0x11;
  setupctx->fiolcxinc = 0x1d;
  sVar12 = fread(resname,0x16,1,pFVar10);
  if (sVar12 == 1) {
    if (CONCAT26(resname._11_2_,
                 CONCAT15(resname[10],
                          CONCAT14(resname[9],
                                   CONCAT13(resname[8],
                                            CONCAT12(resname[7],CONCAT11(resname[6],resname[5]))))))
        != 0x1a0d0a6e696220 ||
        CONCAT17(resname[7],
                 CONCAT16(resname[6],
                          CONCAT15(resname[5],
                                   CONCAT14(resname[4],
                                            CONCAT13(resname[3],
                                                     CONCAT12(resname[2],
                                                              CONCAT11(resname[1],resname[0])))))))
        != 0x6962203253444154) {
      errsigf(ctx,"TADS",0x260);
    }
    if (((CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x302e32 ||
          CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x322e3276) &&
        (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x302e30 ||
         CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x302e3276)) &&
       (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) != 0x312e30 ||
        CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) != 0x302e3276)) {
LAB_0012a30f:
      errsigf(ctx,"TADS",0x263);
    }
    sVar12 = fread(vctx->voccxtim,0x1a,1,pFVar10);
    if (sVar12 == 1) {
      if ((CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) == 0x302e30 &&
           CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) == 0x302e3276) ||
         (CONCAT22(resname._18_2_,CONCAT11(resname[0x11],resname[0x10])) == 0x312e30 &&
          CONCAT13(resname[0x10],CONCAT21(resname._14_2_,resname[0xd])) == 0x302e3276)) {
        *(byte *)&mctx->mcmcxflg = (byte)mctx->mcmcxflg | 1;
      }
      *flagp = resname._20_4_ & 0xffff;
      setupctx->fiolcxflg = resname._20_4_ & 0xffff;
      sVar12 = fread(resname,1,1,pFVar10);
      if (sVar12 == 1) {
        inc = 0x1d;
        uVar21 = 0x11;
        __off = 0;
        __off_00 = __off;
LAB_001287cb:
LAB_001287dd:
        sVar12 = fread(resname + 1,(ulong)(byte)resname[0] + 4,1,pFVar10);
        if (sVar12 != 1) goto LAB_0012a20f;
        if (5 < (byte)resname[0] - 3) goto switchD_00128836_caseD_5;
        uVar25 = (ulong)*(uint *)(resname + (ulong)(byte)resname[0] + 1);
        switch((uint)(byte)resname[0]) {
        case 3:
          if (resname[3] == 'J' && CONCAT11(resname[2],resname[1]) == 0x424f) {
            if ((*flagp & 0x20) != 0) goto LAB_00128999;
            lVar15 = ftell(pFVar10);
            loadhd = lVar15 - uVar11;
            goto joined_r0x0012934e;
          }
          if (resname[3] != 'T' || CONCAT11(resname[2],resname[1]) != 0x5346) {
            if (resname[3] == 'H' && CONCAT11(resname[2],resname[1]) == 0x4e49) {
              lVar15 = ftell(pFVar10);
              uVar28 = lVar15 - uVar11;
              sVar12 = uVar25 - uVar28;
              if ((0xfffffffd < sVar12 - 1) ||
                 (__ptr = (ushort *)malloc(sVar12), uVar20 = sVar12, puVar27 = __ptr,
                 __ptr == (ushort *)0x0)) goto joined_r0x0012960c;
              goto LAB_00128e7c;
            }
            if (resname[3] == 'Q' && CONCAT11(resname[2],resname[1]) == 0x4552) {
              lVar15 = ftell(pFVar10);
              uVar25 = (uVar11 - lVar15) + uVar25;
              uVar22 = (uint)uVar25;
              sVar12 = fread(resname,uVar25 & 0xffffffff,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              vctx->voccxme_init = CONCAT11(resname[1],resname[0]);
              vctx->voccxme = CONCAT11(resname[1],resname[0]);
              vctx->voccxvtk = CONCAT11(resname[3],resname[2]);
              vctx->voccxstr = CONCAT11(resname[5],resname[4]);
              vctx->voccxnum =
                   (short)(CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4])))
                          >> 0x10);
              vctx->voccxprd = CONCAT11(resname[9],resname[8]);
              vctx->voccxvag = (short)CONCAT21(resname._11_2_,resname[10]);
              vctx->voccxini =
                   (short)(CONCAT13(resname[0xd],CONCAT21(resname._11_2_,resname[10])) >> 0x10);
              vctx->voccxpre = resname._14_2_;
              vctx->voccxper = CONCAT11(resname[0x11],resname[0x10]);
              if ((int)uVar22 < 0x14) {
                vctx->voccxprom = 0xffff;
LAB_00129b09:
                vctx->voccxpdis = 0xffff;
                vctx->voccxper2 = 0xffff;
                vctx->voccxpdef = 0xffff;
LAB_00129b1c:
                vctx->voccxpask = 0xffff;
LAB_00129b25:
                vctx->voccxppc = 0xffff;
LAB_00129b2e:
                vctx->voccxpask2 = 0xffff;
LAB_00129b37:
                vctx->voccxperp = 0xffff;
LAB_00129b40:
                vctx->voccxpostprom = 0xffff;
                vctx->voccxinitrestore = 0xffff;
LAB_00129b52:
                vctx->voccxpuv = 0xffff;
                vctx->voccxpnp = 0xffff;
LAB_00129b5c:
                vctx->voccxpostact = 0xffff;
                vctx->voccxprecmd = 0xffff;
                vctx->voccxendcmd = 0xffff;
LAB_00129b6f:
                vctx->voccxpask3 = 0xffff;
LAB_00129b78:
                oVar7 = 0xffff;
                vctx->voccxpre2 = 0xffff;
              }
              else {
                vctx->voccxprom = resname._18_2_;
                if (uVar22 < 0x1a) goto LAB_00129b09;
                *(undefined4 *)&vctx->voccxpdis = resname._20_4_;
                vctx->voccxpdef = resname._24_2_;
                if (uVar22 < 0x1c) goto LAB_00129b1c;
                vctx->voccxpask = resname._26_2_;
                if (uVar22 < 0x1e) goto LAB_00129b25;
                vctx->voccxppc = resname._28_2_;
                if (uVar22 < 0x20) goto LAB_00129b2e;
                vctx->voccxpask2 = resname._30_2_;
                if (uVar22 < 0x22) goto LAB_00129b37;
                vctx->voccxperp = resname._32_2_;
                if (uVar22 < 0x26) goto LAB_00129b40;
                vctx->voccxpostprom = resname._34_2_;
                vctx->voccxinitrestore = resname._36_2_;
                if (uVar22 < 0x2a) goto LAB_00129b52;
                *(undefined4 *)&vctx->voccxpuv = resname._38_4_;
                if (uVar22 < 0x30) goto LAB_00129b5c;
                vctx->voccxpostact = resname._42_2_;
                auVar29 = pshuflw(ZEXT416((uint)resname._44_4_),ZEXT416((uint)resname._44_4_),0xe1);
                vctx->voccxprecmd = (short)auVar29._0_4_;
                vctx->voccxendcmd = (short)((uint)auVar29._0_4_ >> 0x10);
                if (uVar22 < 0x32) goto LAB_00129b6f;
                vctx->voccxpask3 = resname._48_2_;
                if (uVar22 < 0x36) goto LAB_00129b78;
                vctx->voccxpre2 = resname._50_2_;
                oVar7 = resname._52_2_;
              }
              vctx->voccxpdef2 = oVar7;
            }
            else {
              if (resname[3] == 'C' && CONCAT11(resname[2],resname[1]) == 0x4f56) {
                lVar15 = ftell(pFVar10);
                uVar28 = lVar15 - uVar11;
                sVar12 = uVar25 - uVar28;
                if ((0xfffffffd < sVar12 - 1) ||
                   (__ptr = (ushort *)malloc(sVar12), uVar20 = sVar12, puVar27 = __ptr,
                   __ptr == (ushort *)0x0)) goto joined_r0x00129713;
                goto LAB_0012944a;
              }
              if (resname[3] == 'C' && CONCAT11(resname[2],resname[1]) == 0x5253) {
                if (vctx->voccxrun->runcxdbg == (dbgcxdef *)0x0) goto LAB_00128999;
                goto LAB_001295d3;
              }
              if (resname[3] != 'I' || CONCAT11(resname[2],resname[1]) != 0x5358) break;
              sVar12 = fread(resname,2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              uVar21 = (uint)(byte)resname[0];
              setupctx->fiolcxseed = uVar21;
              inc = (uint)(byte)resname[1];
              setupctx->fiolcxinc = inc;
              fseek(pFVar10,uVar25 + uVar11,0);
            }
            goto LAB_00129d8d;
          }
          if ((*flagp & 0x20) != 0) {
            lVar15 = ftell(pFVar10);
            uVar28 = lVar15 - uVar11;
            sVar12 = uVar25 - uVar28;
            if ((0xfffffffd < sVar12 - 1) ||
               (__ptr_00 = (byte *)malloc(sVar12), pbVar23 = __ptr_00, uVar20 = sVar12,
               __ptr_00 == (byte *)0x0)) goto joined_r0x00129ba9;
            goto LAB_001298e8;
          }
LAB_00128999:
          fseek(pFVar10,uVar25 + uVar11,0);
          sVar12 = fread(resname,1,1,pFVar10);
          if (sVar12 != 1) goto LAB_0012a20f;
          goto LAB_001287dd;
        case 4:
          if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x4e434658) {
            if (vctx->voccxrun->runcxext == (runxdef *)0x0) goto LAB_0012a290;
            sVar12 = fread(resname,3,1,pFVar10);
            if ((sVar12 != 1) ||
               (sVar12 = fread(resname + 3,(ulong)(byte)resname[2],1,pFVar10), sVar12 != 1))
            goto LAB_0012a20f;
          }
          else {
            if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x44504d43) {
              sVar12 = fread(resname,2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              vctx->voccxcpl = (uint)CONCAT11(resname[1],resname[0]);
              puVar13 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1")
              ;
              vctx->voccxcpp = (char *)puVar13;
              sVar12 = fread(puVar13,(ulong)(uint)vctx->voccxcpl,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              if ((*flagp & 8) != 0) {
                puVar13 = (uchar *)vctx->voccxcpp;
                uVar8 = vctx->voccxcpl;
                goto LAB_00128af4;
              }
              goto LAB_00129d8d;
            }
            if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
                0x32435253) {
              if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
                  0x464f4524) break;
              if (__off_00 != 0) {
                fseek(pFVar10,__off_00,0);
                __off_00 = 0;
                goto LAB_00129d8d;
              }
              if ((appctx == (appctxdef *)0x0) ||
                 (appctx->add_resfile == (_func_int_void_ptr_char_ptr *)0x0)) goto LAB_0012a1ea;
              suffix_uc[0] = 'R';
              suffix_uc[1] = 'S';
              suffix_uc[3] = '\0';
              suffix_lc[0] = 'r';
              suffix_lc[1] = 's';
              suffix_lc[3] = '\0';
              iVar18 = 0;
              goto LAB_00129f2b;
            }
            pdVar4 = vctx->voccxrun->runcxdbg;
            if (pdVar4 != (dbgcxdef *)0x0) {
              piVar1 = &pdVar4->dbgcxflg;
              *(byte *)piVar1 = (byte)*piVar1 | 0x40;
            }
          }
LAB_00129d76:
          fseek(pFVar10,uVar25 + uVar11,0);
          goto LAB_00129d8d;
        case 6:
          if (CONCAT11(resname[6],resname[5]) == 0x5254 &&
              CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x53544d46) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a20f;
            uVar22 = (uint)CONCAT11(resname[1],resname[0]);
            puVar13 = mchalo(vctx->voccxerr,(ulong)uVar22,"fiord1");
            sVar12 = fread(puVar13,(ulong)uVar22,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a20f;
            if ((*flagp & 8) != 0) {
              fioxor(puVar13,uVar22,uVar21,inc);
            }
            tiosetfmt(vctx->voccxtio,vctx->voccxrun,puVar13,uVar22);
            if (fmtsp != (uchar **)0x0) {
              *fmtsp = puVar13;
            }
            if (fmtlp != (uint *)0x0) {
              *fmtlp = uVar22;
            }
            goto LAB_00129d8d;
          }
          if (CONCAT11(resname[6],resname[5]) != 0x4241 ||
              CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
              0x544d5953) {
            if (CONCAT11(resname[6],resname[5]) == 0x4753 &&
                CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x4d525245) {
              errini(ctx,(osfildef *)pFVar10);
              goto LAB_00129d76;
            }
            if (CONCAT11(resname[6],resname[5]) == 0x544e &&
                CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x43545845) {
              lVar15 = ftell(pFVar10);
              sVar12 = fread(resname,2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              uVar3 = CONCAT11(resname[1],resname[0]);
              uVar28 = (ulong)((uint)uVar3 * 0x30 & 0xffff);
              prVar16 = (runxdef *)mchalo(ctx,uVar28,"fiord:runxdef");
              memset(prVar16,0,uVar28);
              vctx->voccxrun->runcxext = prVar16;
              vctx->voccxrun->runcxexc = (uint)uVar3;
              if (5 < (uVar25 + uVar11) - lVar15) {
                sVar12 = fread(resname,4,1,pFVar10);
                if (sVar12 != 1) goto LAB_0012a20f;
                __off = (ulong)CONCAT13(resname[3],
                                        CONCAT12(resname[2],CONCAT11(resname[1],resname[0])));
              }
              fseek(pFVar10,uVar25 + uVar11,0);
              goto LAB_00129d8d;
            }
            if (CONCAT11(resname[6],resname[5]) == 0x544e &&
                CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x43505250) {
              sVar12 = fread(resname,2,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              if (pcntptr != (uint *)0x0) {
                *pcntptr = (uint)CONCAT11(resname[1],resname[0]);
              }
              goto LAB_00129d8d;
            }
            if ((tctx != (tokcxdef *)0x0) &&
               (CONCAT11(resname[6],resname[5]) == 0x5050 &&
                CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x53444154)) {
              tok_read_defines(tctx,(osfildef *)pFVar10,ctx);
              goto LAB_00129d8d;
            }
            if (CONCAT11(resname[6],resname[5]) == 0x5445 &&
                CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
                0x53524843) {
              sVar12 = fread(resname,6,1,pFVar10);
              if (((sVar12 != 1) || (0x28 < (ulong)CONCAT11(resname[5],resname[4]))) ||
                 (sVar12 = fread(resname + 6,(ulong)CONCAT11(resname[5],resname[4]),1,pFVar10),
                 sVar12 != 1)) goto LAB_0012a20f;
              resname[4] = '\0';
              cmap_set_game_charset(ctx,resname,resname + 6,argv0);
              goto LAB_00129d8d;
            }
            break;
          }
          pdVar4 = vctx->voccxrun->runcxdbg;
          if (pdVar4 == (dbgcxdef *)0x0) goto LAB_00128999;
          toktab1 = pdVar4->dbgcxtab;
          if (toktab1 == (tokthdef *)0x0) {
            toktab1 = (tokthdef *)mchalo(ctx,0xb50,"fiord:symtab");
            tokthini(ctx,mctx,(toktdef *)toktab1);
            vctx->voccxrun->runcxdbg->dbgcxtab = toktab1;
          }
          sVar12 = fread(resname,4,1,pFVar10);
          pcVar26 = resname + 4;
          if (sVar12 == 1) {
            while ((ulong)(byte)resname[0] != 0) {
              sVar12 = fread(pcVar26,(ulong)(byte)resname[0],1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
              resname[(ulong)(byte)resname[0] + 4] = '\0';
              uVar8 = tokhsh(pcVar26);
              (*(toktab1->tokthsc).toktfadd)
                        (&toktab1->tokthsc,pcVar26,(int)resname[0],(int)resname[1],
                         (int)CONCAT11(resname[3],resname[2]),uVar8);
              sVar12 = fread(resname,4,1,pFVar10);
              if (sVar12 != 1) goto LAB_0012a20f;
            }
            goto LAB_00129d8d;
          }
          goto LAB_0012a20f;
        case 7:
          if (CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4]))) ==
              0x5345524c &&
              CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x4c4d5448) {
            fiordhtml(ctx,(osfildef *)pFVar10,appctx,0,pcVar17);
            goto LAB_00129d76;
          }
          if (CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4]))) ==
              0x54494e49 &&
              CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x49455250) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a20f;
            *preinit = CONCAT11(resname[1],resname[0]);
            goto LAB_00129d8d;
          }
          break;
        case 8:
          if (CONCAT17(resname[8],
                       CONCAT16(resname[7],
                                CONCAT15(resname[6],
                                         CONCAT14(resname[5],
                                                  CONCAT13(resname[4],
                                                           CONCAT12(resname[3],
                                                                    CONCAT11(resname[2],resname[1]))
                                                          ))))) == 0x44524f5743455053) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a20f;
            vctx->voccxspl = (uint)CONCAT11(resname[1],resname[0]);
            puVar13 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1");
            vctx->voccxspp = (char *)puVar13;
            sVar12 = fread(puVar13,(ulong)(uint)vctx->voccxspl,1,pFVar10);
            if (sVar12 != 1) goto LAB_0012a20f;
            if ((*flagp & 8) != 0) {
              puVar13 = (uchar *)vctx->voccxspp;
              uVar8 = vctx->voccxspl;
LAB_00128af4:
              fioxor(puVar13,uVar8,uVar21,inc);
            }
            goto LAB_00129d8d;
          }
        }
switchD_00128836_caseD_5:
        goto LAB_0012a286;
      }
    }
  }
LAB_0012a20f:
  errsigf(ctx,"TADS",0x25f);
LAB_00129f2b:
  pcVar26 = appctx->ext_res_path;
  if (pcVar26 == (char *)0x0) {
    if (pcVar17 == (char *)0x0) {
      resname[0] = '\0';
    }
    else {
      strcpy(resname,pcVar17);
    }
  }
  else {
    filename = os_get_root_name(pcVar17);
    os_build_full_path(resname,0x1000,pcVar26,filename);
  }
  os_remext(resname);
  suffix_uc[2] = (byte)iVar18 | 0x30;
  suffix_lc[2] = suffix_uc[2];
  os_addext(resname,suffix_lc);
  pFVar10 = fopen(resname,"rb");
  if (pFVar10 == (FILE *)0x0) {
    os_remext(resname);
    os_addext(resname,suffix_uc);
    pFVar10 = fopen(resname,"rb");
    if (pFVar10 != (FILE *)0x0) goto LAB_00129fca;
  }
  else {
LAB_00129fca:
    resfileno = (*appctx->add_resfile)(appctx->add_resfile_ctx,resname);
    ctx = vctx->voccxerr;
    lVar15 = ftell(pFVar10);
    sVar12 = fread(local_11c8,0x16,1,pFVar10);
    if (sVar12 != 1) {
LAB_0012a233:
      sVar12 = strlen(resname);
      pcVar17 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar17;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x26a,"TADS");
    }
    if (CONCAT53(uStack_11c0,iStack_11c4._1_3_) != 0x1a0d0a63737220 ||
        CONCAT44(iStack_11c4,local_11c8) != 0x7372203253444154) {
      sVar12 = strlen(resname);
      pcVar17 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar17;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x269,"TADS");
    }
    if (((CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x302e32 || local_11bb != 0x322e3276) &&
        (CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x302e30 || local_11bb != 0x302e3276)) &&
       (CONCAT31(uStack_11b7,local_11bb._3_1_) != 0x312e30 || local_11bb != 0x302e3276))
    goto LAB_0012a30f;
    sVar12 = fread(local_11c8,0x1a,1,pFVar10);
    if (sVar12 != 1) goto LAB_0012a233;
    while( true ) {
      sVar12 = fread(local_11c8,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a233;
      sVar12 = fread(local_11c8 + 1,(ulong)local_11c8[0] + 4,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a233;
      if (((uint)local_11c8 & 0xff) != 7) break;
      if (iStack_11c4 != 0x5345524c ||
          CONCAT13((undefined1)iStack_11c4,local_11c8._1_3_) != 0x4c4d5448) goto LAB_0012a286;
      uVar21 = *(uint *)(local_11c8 + (ulong)local_11c8[0] + 1);
      fiordhtml(ctx,(osfildef *)pFVar10,appctx,resfileno,resname);
      fseek(pFVar10,(ulong)uVar21 + lVar15,0);
    }
    if ((((uint)local_11c8 & 0xff) != 4) ||
       (CONCAT13((undefined1)iStack_11c4,local_11c8._1_3_) != 0x464f4524)) {
LAB_0012a286:
      errsigf(ctx,"TADS",0x261);
    }
    fclose(pFVar10);
  }
  iVar18 = iVar18 + 1;
  if (iVar18 == 9) {
LAB_0012a1ea:
    vctx->voccxerr->errcxptr = fr_.errprv;
    return;
  }
  goto LAB_00129f2b;
  while( true ) {
    uVar20 = uVar20 - sVar9;
    pbVar24 = __ptr_00;
    pbVar23 = pbVar23 + sVar9;
    if (uVar20 == 0) break;
LAB_001298e8:
    sVar9 = 0xffff;
    if (uVar20 < 0xffff) {
      sVar9 = uVar20;
    }
    sVar14 = fread(pbVar23,sVar9,1,pFVar10);
    if (sVar14 != 1) goto LAB_0012a20f;
  }
  do {
    uVar3 = *(ushort *)(pbVar24 + 1);
    if (*pbVar24 - 1 < 2) {
      mcmrsrv(mctx,*(ushort *)(pbVar24 + 3),uVar3,(ulong)*(uint *)(pbVar24 + 7));
      pbVar24 = pbVar24 + 0xb;
      sVar12 = sVar12 - 0xb;
      if ((flags & 2U) != 0) {
        mcmlck(mctx,uVar3);
        mcmunlck(mctx,uVar3);
      }
    }
    else {
      if (*pbVar24 != 10) goto LAB_0012a2a6;
      prVar16 = vctx->voccxrun->runcxext;
      if (prVar16 == (runxdef *)0x0) goto LAB_0012a290;
      pcVar26 = prVar16->runxnam + (uint)uVar3 * 0x30;
      memcpy(pcVar26,pbVar24 + 4,(ulong)pbVar24[3]);
      pcVar26[pbVar24[3]] = '\0';
      sVar12 = sVar12 - ((ulong)pbVar24[3] + 4);
      pbVar24 = pbVar24 + (ulong)pbVar24[3] + 4;
    }
  } while (sVar12 != 0);
  free(__ptr_00);
  fseek(pFVar10,uVar11 + uVar25,0);
  goto LAB_00129d2a;
joined_r0x00129ba9:
  if (uVar25 != uVar28) {
    sVar12 = fread(resname,3,1,pFVar10);
    if (sVar12 != 1) goto LAB_0012a20f;
    uVar3 = CONCAT11(resname[2],resname[1]);
    if ((byte)resname[0] - 1 < 2) {
      sVar12 = fread(resname + 3,8,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,
              (ulong)CONCAT13(resname[10],CONCAT12(resname[9],CONCAT11(resname[8],resname[7]))));
      uVar28 = uVar28 + 0xb;
      if ((flags & 2U) != 0) {
        mcmlck(mctx,uVar3);
        mcmunlck(mctx,uVar3);
        fseek(pFVar10,uVar28 + uVar11,0);
      }
    }
    else {
      if ((byte)resname[0] != 10) goto LAB_0012a2a6;
      prVar16 = vctx->voccxrun->runcxext;
      if (prVar16 == (runxdef *)0x0) goto LAB_0012a290;
      sVar12 = fread(resname + 3,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      pcVar26 = prVar16->runxnam + (uint)uVar3 * 0x30;
      sVar12 = fread(pcVar26,(ulong)(byte)resname[3],1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      pcVar26[(byte)resname[3]] = '\0';
      uVar28 = uVar28 + (byte)resname[3] + 4;
    }
    goto joined_r0x00129ba9;
  }
LAB_00129d2a:
  if (__off == 0) {
    __off = 0;
  }
  else {
    fseek(pFVar10,__off,0);
    __off_00 = uVar25;
  }
  goto LAB_00129d8d;
  while( true ) {
    uVar20 = uVar20 - sVar9;
    puVar19 = __ptr;
    puVar27 = (ushort *)((long)puVar27 + sVar9);
    if (uVar20 == 0) break;
LAB_00128e7c:
    sVar9 = 0xffff;
    if (uVar20 < 0xffff) {
      sVar9 = uVar20;
    }
    sVar14 = fread(puVar27,sVar9,1,pFVar10);
    if (sVar14 != 1) goto LAB_0012a20f;
  }
  do {
    uVar3 = *(ushort *)((long)puVar19 + 7);
    uVar2 = *(ushort *)((long)puVar19 + 1);
    vociadd(vctx,uVar2,*(objnum *)((long)puVar19 + 3),(uint)uVar3,(objnum *)((long)puVar19 + 9),
            (byte)*puVar19 | 4);
    (vctx->voccxinh[uVar2 >> 8][(ulong)uVar2 & 0xff]->vociu).vocius.vociusilc =
         *(objnum *)((long)puVar19 + 5);
    sVar12 = sVar12 - ((ulong)uVar3 * 2 + 9);
    puVar19 = (ushort *)((long)puVar19 + (ulong)uVar3 * 2 + 9);
  } while (sVar12 != 0);
  goto LAB_00129520;
joined_r0x0012960c:
  if (uVar25 == uVar28) goto LAB_00129d8d;
  sVar12 = fread(resname,9,1,pFVar10);
  cVar6 = resname[2];
  cVar5 = resname[1];
  if (sVar12 != 1) goto LAB_0012a20f;
  uVar3 = CONCAT11(resname[8],resname[7]);
  oVar7 = CONCAT11(resname[2],resname[1]);
  if (uVar3 == 0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (uint)uVar3 * 2;
    sVar12 = fread(resname + 9,(ulong)uVar22,1,pFVar10);
    if (sVar12 != 1) goto LAB_0012a20f;
  }
  vociadd(vctx,oVar7,CONCAT11(resname[4],resname[3]),(uint)uVar3,(objnum *)(resname + 9),
          (byte)resname[0] | 4);
  (vctx->voccxinh[(byte)cVar6][(byte)cVar5]->vociu).vocius.vociusilc =
       CONCAT11(resname[6],resname[5]);
  uVar28 = uVar22 + uVar28 + 9;
  goto joined_r0x0012960c;
LAB_001295d3:
  lVar15 = ftell(pFVar10);
  if (lVar15 - uVar11 == uVar25) goto LAB_00129d8d;
  iVar18 = linfload((osfildef *)pFVar10,vctx->voccxrun->runcxdbg,ctx,path);
  if (iVar18 != 0) goto LAB_0012a20f;
  goto LAB_001295d3;
  while( true ) {
    uVar20 = uVar20 - sVar9;
    puVar27 = (ushort *)((long)puVar27 + sVar9);
    puVar19 = __ptr;
    if (uVar20 == 0) break;
LAB_0012944a:
    sVar9 = 0xffff;
    if (uVar20 < 0xffff) {
      sVar9 = uVar20;
    }
    sVar14 = fread(puVar27,sVar9,1,pFVar10);
    if (sVar14 != 1) goto LAB_0012a20f;
  }
  do {
    uVar22 = (uint)*puVar19;
    uVar3 = puVar19[1];
    if ((*flagp & 8) == 0) {
      siz = uVar3 + uVar22;
    }
    else {
      siz = uVar3 + uVar22;
      fioxor((uchar *)(puVar19 + 5),siz,uVar21,inc);
    }
    pbVar23 = (byte *)0x0;
    if (uVar3 != 0) {
      pbVar23 = (byte *)((long)puVar19 + (ulong)uVar22 + 10);
    }
    vocadd2(vctx,puVar19[2],puVar19[3],(uint)puVar19[4],(uchar *)(puVar19 + 5),uVar22,pbVar23,
            (uint)uVar3);
    sVar12 = sVar12 - ((ulong)siz + 10);
    puVar19 = (ushort *)((long)puVar19 + (ulong)siz + 10);
  } while (sVar12 != 0);
LAB_00129520:
  free(__ptr);
LAB_00129d8d:
  sVar12 = fread(resname,1,1,pFVar10);
  if (sVar12 != 1) goto LAB_0012a20f;
  goto LAB_001287cb;
joined_r0x00129713:
  if (uVar25 == uVar28) goto LAB_00129d8d;
  sVar12 = fread(resname,10,1,pFVar10);
  if (sVar12 != 1) goto LAB_0012a20f;
  uVar3 = CONCAT11(resname[1],resname[0]);
  uVar2 = CONCAT11(resname[3],resname[2]);
  uVar22 = (uint)uVar2 + (uint)uVar3;
  sVar12 = fread(resname + 10,(ulong)uVar22,1,pFVar10);
  if (sVar12 != 1) goto LAB_0012a20f;
  if ((*flagp & 8) != 0) {
    fioxor((uchar *)(resname + 10),uVar22,uVar21,inc);
  }
  puVar13 = (uchar *)0x0;
  if (uVar2 != 0) {
    puVar13 = (uchar *)(resname + 10 + uVar3);
  }
  vocadd2(vctx,CONCAT11(resname[5],resname[4]),CONCAT11(resname[7],resname[6]),
          (uint)CONCAT11(resname[9],resname[8]),(uchar *)(resname + 10),(uint)uVar3,puVar13,
          (uint)uVar2);
  uVar28 = uVar22 + uVar28 + 10;
  goto joined_r0x00129713;
joined_r0x0012934e:
  if (loadhd != uVar25) {
    sVar12 = fread(resname,3,1,pFVar10);
    if (sVar12 != 1) goto LAB_0012a20f;
    uVar3 = CONCAT11(resname[2],resname[1]);
    if ((byte)resname[0] - 1 < 2) {
      sVar12 = fread(resname + 3,4,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,loadhd);
      uVar2 = CONCAT11(resname[6],resname[5]);
      if ((flags & 2U) != 0) {
        mcmlck(mctx,uVar3);
        mcmunlck(mctx,uVar3);
      }
      loadhd = uVar2 + loadhd + 7;
      fseek(pFVar10,loadhd + uVar11,0);
    }
    else if ((byte)resname[0] - 7 < 2) {
      sVar12 = fread(resname + 3,2,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      uVar2 = CONCAT11(resname[4],resname[3]);
      puVar13 = mcmalo0(mctx,uVar2,(mcmon *)0x0,uVar3,0);
      sVar12 = fread(puVar13,(ulong)uVar2,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      mcmunlck(mctx,uVar3);
      loadhd = (ulong)uVar2 + 5 + loadhd;
    }
    else {
      if (resname[0] != '\n') {
LAB_0012a2a6:
        errsigf(ctx,"TADS",0x262);
      }
      prVar16 = vctx->voccxrun->runcxext;
      if (prVar16 == (runxdef *)0x0) {
LAB_0012a290:
        errsigf(ctx,"TADS",0x266);
      }
      sVar12 = fread(resname + 3,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      pcVar26 = prVar16->runxnam + (uint)uVar3 * 0x30;
      sVar12 = fread(pcVar26,(ulong)(byte)resname[3],1,pFVar10);
      if (sVar12 != 1) goto LAB_0012a20f;
      pcVar26[(byte)resname[3]] = '\0';
      loadhd = (byte)resname[3] + loadhd + 4;
    }
    goto joined_r0x0012934e;
  }
  goto LAB_00129d8d;
}

Assistant:

void fiord(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tctx, char *fname,
           char *exename, fiolcxdef *setupctx, objnum *preinit, uint *flagp,
           tokpdef *path, uchar **fmtsp, uint *fmtlp, uint *pcntptr,
           int flags, struct appctxdef *appctx, char *argv0)
{
    osfildef *fp;
    ulong     startofs;
    char     *display_fname;
    
    /* presume there will be no need to run preinit */
    *preinit = MCMONINV;

    /* 
     *   get the display filename - use the real filename if one is
     *   provided, otherwise use the name of the executable file itself 
     */
    display_fname = (fname != 0 ? fname : exename);

    /* save the filename in G_os_gamename */
    if (display_fname != 0)
    {
        size_t copylen;

        /* limit the copy to the buffer size */
        if ((copylen = strlen(display_fname)) > sizeof(G_os_gamename) - 1)
            copylen = sizeof(G_os_gamename) - 1;

        /* save it */
        memcpy(G_os_gamename, display_fname, copylen);
        G_os_gamename[copylen] = '\0';
    }
    else
        G_os_gamename[0] = '\0';
    
    /* open the file and read and check file header */
    fp = (fname != 0 ? osfoprb(fname, OSFTGAME)
                     : os_exeseek(exename, "TGAM"));
    if (fp == 0)
        errsig(vctx->voccxerr, ERR_OPRGAM);

    /* 
     *   we've identified the .GAM file source - tell the host system
     *   about it, if it's interested 
     */
    if (appctx != 0 && appctx->set_game_name != 0)
        (*appctx->set_game_name)(appctx->set_game_name_ctx, display_fname);

    /* remember starting location in file */
    startofs = osfpos(fp);

    ERRBEGIN(vctx->voccxerr)

    /* 
     *   Read the game file.  Note that the .GAM file always has resource
     *   file number zero. 
     */
    fiord1(mctx, vctx, tctx, fp, display_fname,
           setupctx, startofs, preinit, flagp, path,
           fmtsp, fmtlp, pcntptr, flags, appctx, argv0);

    /*
     *   If the host system accepts additional resource files, look for
     *   additional resource files.  These are files in the same directory
     *   as the .GAM file, with the .GAM suffix replaced by suffixes from
     *.  RS0 to .RS9.  
     */
    if (appctx != 0 && appctx->add_resfile != 0)
    {
        char suffix_lc[4];
        char suffix_uc[4];
        int i;
        char *base_name;

        /* use the game or executable filename, as appropriate */
        base_name = display_fname;

        /* build the initial suffixes - try both upper- and lower-case */
        suffix_uc[0] = 'R';
        suffix_uc[1] = 'S';
        suffix_uc[3] = '\0';
        suffix_lc[0] = 'r';
        suffix_lc[1] = 's';
        suffix_lc[3] = '\0';

        /* loop through each possible suffix (.RS0 through .RS9) */
        for (i = 0 ; i < 9 ; ++i)
        {
            char resname[OSFNMAX];
            osfildef *fpres;
            int resfileno;

            /* 
             *   Build the next resource filename.  If there's an explicit
             *   resource path, use it, otherwise use the same directory
             *   that contains the .GAM file. 
             */
            if (appctx->ext_res_path != 0)
            {
                /*
                 *   There's an explicit resource path - append the root
                 *   (filename-only, minus path) portion of the .GAM file
                 *   name to the resource path. 
                 */
                os_build_full_path(resname, sizeof(resname),
                                   appctx->ext_res_path,
                                   os_get_root_name(base_name));
            }
            else
            {
                /* 
                 *   there's no resource path - use the entire .GAM
                 *   filename, including directory, so that we look in the
                 *   same directory that contains the .GAM file 
                 */
                if (base_name != 0)
                    strcpy(resname, base_name);
                else
                    resname[0] = '\0';
            }

            /* add the current extension (replacing any current extension) */
            os_remext(resname);
            suffix_lc[2] = suffix_uc[2] = '0' + i;
            os_addext(resname, suffix_lc);

            /* try opening the file */
            fpres = osfoprb(resname, OSFTGAME);

            /* if that didn't work, try the upper-case name */
            if (fpres == 0)
            {
                /* replace the suffix with the upper-case version */
                os_remext(resname);
                os_addext(resname, suffix_uc);

                /* try again with the new name */
                fpres = osfoprb(resname, OSFTGAME);
            }

            /* if we opened it successfully, read it */
            if (fpres != 0)
            {
                /* tell the host system about it */
                resfileno = (*appctx->add_resfile)
                            (appctx->add_resfile_ctx, resname);

                /* read the file */
                fiordrscext(vctx->voccxerr, fpres, appctx,
                            resfileno, resname);

                /* we're done with the file, so close it */
                osfcls(fpres);
            }
        }
    }

    ERRCLEAN(vctx->voccxerr)
        /* if an error occurs during read, clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr);
}